

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

int json_serialize_string(char *string,size_t len,char *buf)

{
  int iVar1;
  int local_3c;
  int local_38;
  int written_total;
  int written;
  char c;
  size_t i;
  char *buf_local;
  size_t len_local;
  char *string_local;
  
  local_3c = append_string(buf,"\"");
  if (local_3c < 0) {
    string_local._4_4_ = -1;
  }
  else {
    i = (size_t)buf;
    if (buf != (char *)0x0) {
      i = (size_t)(buf + local_3c);
    }
    for (_written = 0; _written < len; _written = _written + 1) {
      switch(string[_written]) {
      case '\0':
        iVar1 = append_string((char *)i,"\\u0000");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x01':
        iVar1 = append_string((char *)i,"\\u0001");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x02':
        iVar1 = append_string((char *)i,"\\u0002");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x03':
        iVar1 = append_string((char *)i,"\\u0003");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x04':
        iVar1 = append_string((char *)i,"\\u0004");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x05':
        iVar1 = append_string((char *)i,"\\u0005");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x06':
        iVar1 = append_string((char *)i,"\\u0006");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\a':
        iVar1 = append_string((char *)i,"\\u0007");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\b':
        iVar1 = append_string((char *)i,"\\b");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\t':
        iVar1 = append_string((char *)i,"\\t");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\n':
        iVar1 = append_string((char *)i,"\\n");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\v':
        iVar1 = append_string((char *)i,"\\u000b");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\f':
        iVar1 = append_string((char *)i,"\\f");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\r':
        iVar1 = append_string((char *)i,"\\r");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x0e':
        iVar1 = append_string((char *)i,"\\u000e");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x0f':
        iVar1 = append_string((char *)i,"\\u000f");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x10':
        iVar1 = append_string((char *)i,"\\u0010");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x11':
        iVar1 = append_string((char *)i,"\\u0011");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x12':
        iVar1 = append_string((char *)i,"\\u0012");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x13':
        iVar1 = append_string((char *)i,"\\u0013");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x14':
        iVar1 = append_string((char *)i,"\\u0014");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x15':
        iVar1 = append_string((char *)i,"\\u0015");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x16':
        iVar1 = append_string((char *)i,"\\u0016");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x17':
        iVar1 = append_string((char *)i,"\\u0017");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x18':
        iVar1 = append_string((char *)i,"\\u0018");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x19':
        iVar1 = append_string((char *)i,"\\u0019");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x1a':
        iVar1 = append_string((char *)i,"\\u001a");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x1b':
        iVar1 = append_string((char *)i,"\\u001b");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x1c':
        iVar1 = append_string((char *)i,"\\u001c");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x1d':
        iVar1 = append_string((char *)i,"\\u001d");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x1e':
        iVar1 = append_string((char *)i,"\\u001e");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '\x1f':
        iVar1 = append_string((char *)i,"\\u001f");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      default:
        if (i != 0) {
          *(char *)i = string[_written];
          i = i + 1;
        }
        local_3c = local_3c + 1;
        break;
      case '\"':
        iVar1 = append_string((char *)i,"\\\"");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
        break;
      case '/':
        if (parson_escape_slashes == 0) {
          local_38 = append_string((char *)i,"/");
          if (local_38 < 0) {
            return -1;
          }
          if (i != 0) {
            i = i + (long)local_38;
          }
        }
        else {
          local_38 = append_string((char *)i,"\\/");
          if (local_38 < 0) {
            return -1;
          }
          if (i != 0) {
            i = i + (long)local_38;
          }
        }
        local_3c = local_38 + local_3c;
        break;
      case '\\':
        iVar1 = append_string((char *)i,"\\\\");
        if (iVar1 < 0) {
          return -1;
        }
        if (i != 0) {
          i = i + (long)iVar1;
        }
        local_3c = iVar1 + local_3c;
      }
    }
    iVar1 = append_string((char *)i,"\"");
    if (iVar1 < 0) {
      string_local._4_4_ = -1;
    }
    else {
      string_local._4_4_ = iVar1 + local_3c;
    }
  }
  return string_local._4_4_;
}

Assistant:

static int json_serialize_string(const char *string, size_t len, char *buf) {
    size_t i = 0;
    char c = '\0';
    int written = -1, written_total = 0;
    APPEND_STRING("\"");
    for (i = 0; i < len; i++) {
        c = string[i];
        switch (c) {
            case '\"': APPEND_STRING("\\\""); break;
            case '\\': APPEND_STRING("\\\\"); break;
            case '\b': APPEND_STRING("\\b"); break;
            case '\f': APPEND_STRING("\\f"); break;
            case '\n': APPEND_STRING("\\n"); break;
            case '\r': APPEND_STRING("\\r"); break;
            case '\t': APPEND_STRING("\\t"); break;
            case '\x00': APPEND_STRING("\\u0000"); break;
            case '\x01': APPEND_STRING("\\u0001"); break;
            case '\x02': APPEND_STRING("\\u0002"); break;
            case '\x03': APPEND_STRING("\\u0003"); break;
            case '\x04': APPEND_STRING("\\u0004"); break;
            case '\x05': APPEND_STRING("\\u0005"); break;
            case '\x06': APPEND_STRING("\\u0006"); break;
            case '\x07': APPEND_STRING("\\u0007"); break;
            /* '\x08' duplicate: '\b' */
            /* '\x09' duplicate: '\t' */
            /* '\x0a' duplicate: '\n' */
            case '\x0b': APPEND_STRING("\\u000b"); break;
            /* '\x0c' duplicate: '\f' */
            /* '\x0d' duplicate: '\r' */
            case '\x0e': APPEND_STRING("\\u000e"); break;
            case '\x0f': APPEND_STRING("\\u000f"); break;
            case '\x10': APPEND_STRING("\\u0010"); break;
            case '\x11': APPEND_STRING("\\u0011"); break;
            case '\x12': APPEND_STRING("\\u0012"); break;
            case '\x13': APPEND_STRING("\\u0013"); break;
            case '\x14': APPEND_STRING("\\u0014"); break;
            case '\x15': APPEND_STRING("\\u0015"); break;
            case '\x16': APPEND_STRING("\\u0016"); break;
            case '\x17': APPEND_STRING("\\u0017"); break;
            case '\x18': APPEND_STRING("\\u0018"); break;
            case '\x19': APPEND_STRING("\\u0019"); break;
            case '\x1a': APPEND_STRING("\\u001a"); break;
            case '\x1b': APPEND_STRING("\\u001b"); break;
            case '\x1c': APPEND_STRING("\\u001c"); break;
            case '\x1d': APPEND_STRING("\\u001d"); break;
            case '\x1e': APPEND_STRING("\\u001e"); break;
            case '\x1f': APPEND_STRING("\\u001f"); break;
            case '/':
                if (parson_escape_slashes) {
                    APPEND_STRING("\\/");  /* to make json embeddable in xml\/html */
                } else {
                    APPEND_STRING("/");
                }
                break;
            default:
                if (buf != NULL) {
                    buf[0] = c;
                    buf += 1;
                }
                written_total += 1;
                break;
        }
    }
    APPEND_STRING("\"");
    return written_total;
}